

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O3

bool __thiscall
FIX::SocketServer::block(SocketServer *this,Strategy *strategy,bool poll,double timeout)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  SocketToInfo *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> sockets;
  ServerWrapper wrapper;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_a8;
  Strategy local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_70;
  SocketServer *local_40;
  Strategy *local_38;
  
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (this->m_socketToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_socketToInfo)._M_t._M_impl.super__Rb_tree_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      bVar2 = socket_isValid(p_Var3[1]._M_color);
      if (!bVar2) {
        bVar2 = false;
        goto LAB_001bbbfe;
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_d8,(int *)(p_Var3 + 1));
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_a8,&local_d8);
  local_78._vptr_Strategy = (_func_int **)&PTR__ServerWrapper_001f7688;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_70,&local_a8);
  local_40 = this;
  local_38 = strategy;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_a8);
  SocketMonitor::block(&this->m_monitor,&local_78,poll,timeout);
  local_78._vptr_Strategy = (_func_int **)&PTR__ServerWrapper_001f7688;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_70);
  bVar2 = true;
LAB_001bbbfe:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_d8);
  return bVar2;
}

Assistant:

bool SocketServer::block(Strategy &strategy, bool poll, double timeout) {
  std::set<socket_handle> sockets;
  for (const SocketToInfo::value_type &socketWithInfo : m_socketToInfo) {
    if (!socket_isValid(socketWithInfo.first)) {
      return false;
    }
    sockets.insert(socketWithInfo.first);
  }

  ServerWrapper wrapper(sockets, *this, strategy);
  m_monitor.block(wrapper, poll, timeout);
  return true;
}